

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3NodeWrite(Fts3Table *p,SegmentNode *pTree,int iHeight,sqlite3_int64 iLeaf,
                 sqlite3_int64 iFree,sqlite3_int64 *piLast,char **paRoot,int *pnRoot)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  byte *pbVar4;
  long lVar5;
  SegmentNode *pSVar6;
  sqlite3_int64 iNextFree;
  ulong uVar7;
  bool bVar8;
  
  while( true ) {
    if (pTree->pParent == (SegmentNode *)0x0) {
      lVar5 = 10;
      uVar7 = iLeaf;
      do {
        lVar5 = lVar5 + -1;
        bVar8 = 0x7f < uVar7;
        uVar7 = uVar7 >> 7;
      } while (bVar8);
      pTree->aData[lVar5] = (char)iHeight;
      pbVar4 = (byte *)(pTree->aData + lVar5);
      do {
        pbVar4 = pbVar4 + 1;
        bVar1 = (byte)iLeaf;
        *pbVar4 = bVar1 | 0x80;
        bVar8 = 0x7f < (ulong)iLeaf;
        iLeaf = (ulong)iLeaf >> 7;
      } while (bVar8);
      *pbVar4 = bVar1;
      *piLast = iFree - 1;
      *pnRoot = pTree->nData - (int)lVar5;
      *paRoot = pTree->aData + lVar5;
      return 0;
    }
    pSVar6 = pTree->pLeftmost;
    uVar7 = iFree;
    if (pTree->pLeftmost == (SegmentNode *)0x0) {
      bVar8 = true;
      iVar2 = 0;
    }
    else {
      do {
        lVar5 = 10;
        uVar3 = iLeaf;
        do {
          lVar5 = lVar5 + -1;
          bVar8 = 0x7f < uVar3;
          uVar3 = uVar3 >> 7;
        } while (bVar8);
        pSVar6->aData[lVar5] = (char)iHeight;
        pbVar4 = (byte *)(pSVar6->aData + lVar5);
        uVar3 = iLeaf;
        do {
          pbVar4 = pbVar4 + 1;
          bVar1 = (byte)uVar3;
          *pbVar4 = bVar1 | 0x80;
          bVar8 = 0x7f < uVar3;
          uVar3 = uVar3 >> 7;
        } while (bVar8);
        *pbVar4 = bVar1;
        iVar2 = fts3WriteSegment(p,uVar7,pSVar6->aData + lVar5,pSVar6->nData - (int)lVar5);
        uVar7 = uVar7 + 1;
        bVar8 = iVar2 == 0;
      } while ((pSVar6->pRight != (SegmentNode *)0x0) &&
              (iLeaf = iLeaf + pSVar6->nEntry + 1, pSVar6 = pSVar6->pRight, iVar2 == 0));
    }
    if (!bVar8) break;
    pTree = pTree->pParent;
    iHeight = iHeight + 1;
    iLeaf = iFree;
    iFree = uVar7;
  }
  return iVar2;
}

Assistant:

static int fts3NodeWrite(
  Fts3Table *p,                   /* Virtual table handle */
  SegmentNode *pTree,             /* SegmentNode handle */
  int iHeight,                    /* Height of this node in tree */
  sqlite3_int64 iLeaf,            /* Block id of first leaf node */
  sqlite3_int64 iFree,            /* Block id of next free slot in %_segments */
  sqlite3_int64 *piLast,          /* OUT: Block id of last entry written */
  char **paRoot,                  /* OUT: Data for root node */
  int *pnRoot                     /* OUT: Size of root node in bytes */
){
  int rc = SQLITE_OK;

  if( !pTree->pParent ){
    /* Root node of the tree. */
    int nStart = fts3TreeFinishNode(pTree, iHeight, iLeaf);
    *piLast = iFree-1;
    *pnRoot = pTree->nData - nStart;
    *paRoot = &pTree->aData[nStart];
  }else{
    SegmentNode *pIter;
    sqlite3_int64 iNextFree = iFree;
    sqlite3_int64 iNextLeaf = iLeaf;
    for(pIter=pTree->pLeftmost; pIter && rc==SQLITE_OK; pIter=pIter->pRight){
      int nStart = fts3TreeFinishNode(pIter, iHeight, iNextLeaf);
      int nWrite = pIter->nData - nStart;
  
      rc = fts3WriteSegment(p, iNextFree, &pIter->aData[nStart], nWrite);
      iNextFree++;
      iNextLeaf += (pIter->nEntry+1);
    }
    if( rc==SQLITE_OK ){
      assert( iNextLeaf==iFree );
      rc = fts3NodeWrite(
          p, pTree->pParent, iHeight+1, iFree, iNextFree, piLast, paRoot, pnRoot
      );
    }
  }

  return rc;
}